

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void store_reset(void)

{
  town_conflict *town;
  town *ptVar1;
  store *store;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  for (lVar3 = 0; lVar3 < world->num_towns; lVar3 = lVar3 + 1) {
    ptVar1 = world->towns;
    town = (town_conflict *)(ptVar1 + lVar3);
    store = ptVar1[lVar3].stores;
    if (ptVar1[lVar3].index == (int)player->home) {
      place_home(town);
    }
    else if (store->sidx == store_home_idx) {
      town->stores = store->next;
      free_store(store);
      store = town->stores;
    }
    for (; store != (store *)0x0; store = store->next) {
      store->stock_num = '\0';
      object_pile_free((chunk *)0x0,(chunk *)0x0,store->stock_k);
      object_pile_free((chunk *)0x0,(chunk *)0x0,store->stock);
      store->stock = (object *)0x0;
      store->stock_k = (object *)0x0;
      if (store->sidx != store_home_idx) {
        store_shuffle(store);
        iVar2 = 10;
        while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
          store_maint(store);
        }
      }
    }
  }
  return;
}

Assistant:

void store_reset(void) {
	int i, j;

	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;

		/* Place the home in the hometown */
		if (town->index == player->home) {
			place_home(town);
		} else {
			/* May need to remove previous home for a dead character */
			if (store_is_home(s)) {
				town->stores = s->next;
				free_store(s);
				s = town->stores;
			}
		}

		/* Initial stock setup for stores */
		while (s) {
			s->stock_num = 0;
			object_pile_free(NULL, NULL, s->stock_k);
			object_pile_free(NULL, NULL, s->stock);
			s->stock_k = NULL;
			s->stock = NULL;
			if (store_is_home(s)) {
				s = s->next;
				continue;
			}
			store_shuffle(s);
			for (j = 0; j < 10; j++)
				store_maint(s);
			s = s->next;
		}
	}
}